

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O0

void __thiscall CSocekt::ReadConf(CSocekt *this)

{
  int iVar1;
  Config *in_RDI;
  int in_stack_ffffffffffffffec;
  undefined4 uVar2;
  Config *this_00;
  
  this_00 = in_RDI;
  flyd::Singleton<flyd::Config>::getInstance();
  iVar1 = flyd::Config::GetIntDefault(this_00,(char *)in_RDI,in_stack_ffffffffffffffec);
  *(int *)((long)&in_RDI[1].config_map_._M_h._M_single_bucket + 4) = iVar1;
  flyd::Singleton<flyd::Config>::getInstance();
  iVar1 = flyd::Config::GetIntDefault(this_00,(char *)in_RDI,in_stack_ffffffffffffffec);
  *(int *)&in_RDI[2].config_map_._M_h._M_buckets = iVar1;
  flyd::Singleton<flyd::Config>::getInstance();
  iVar1 = flyd::Config::GetIntDefault(this_00,(char *)in_RDI,in_stack_ffffffffffffffec);
  *(int *)&in_RDI[0x76].config_map_._M_h._M_single_bucket = iVar1;
  flyd::Singleton<flyd::Config>::getInstance();
  iVar1 = flyd::Config::GetIntDefault(this_00,(char *)in_RDI,in_stack_ffffffffffffffec);
  *(int *)&in_RDI[1].config_map_._M_h._M_single_bucket = iVar1;
  if (*(int *)&in_RDI[1].config_map_._M_h._M_single_bucket < 6) {
    uVar2 = 5;
  }
  else {
    uVar2 = *(undefined4 *)&in_RDI[1].config_map_._M_h._M_single_bucket;
  }
  *(undefined4 *)&in_RDI[1].config_map_._M_h._M_single_bucket = uVar2;
  return;
}

Assistant:

void CSocekt::ReadConf()
{
 //   CConfig *p_config = CConfig::GetInstance();
    m_worker_connections = Singleton<Config>::getInstance().GetIntDefault("worker_connections", 1);
  //  m_worker_connections = p_config->GetIntDefault("worker_connections",m_worker_connections); //epoll连接的最大项数
  //  m_ListenPortCount    = p_config->GetIntDefault("ListenPortCount",m_ListenPortCount);       //取得要监听的端口数量
    m_ListenPortCount = Singleton<Config>::getInstance().GetIntDefault("ListenPortCount", 1);
    //LOG_DEBUG << "worker_connections = " << m_worker_connections << "ListenPortCount = " << m_ListenPortCount;

    m_ifkickTimeCount   =  Singleton<Config>::getInstance().GetIntDefault("Sock_WaitTimeEnable", 0);
    m_iWaitTime         =  Singleton<Config>::getInstance().GetIntDefault("Sock_MaxWaitTime", m_iWaitTime);
    m_iWaitTime         =  (m_iWaitTime > 5) ? m_iWaitTime : 5;

}